

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::KeyValue::KeyValue(KeyValue *this)

{
  *(undefined ***)this = &PTR__KeyValue_019d7600;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  this->__isset = (_KeyValue__isset)((byte)this->__isset & 0xfe);
  return;
}

Assistant:

KeyValue::KeyValue() noexcept
   : key(),
     value() {
}